

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fit-model-multi.cpp
# Opt level: O3

void __thiscall
WeightedIsomapAveraging::WeightedIsomapAveraging
          (WeightedIsomapAveraging *this,float merge_threshold)

{
  float fVar1;
  float fVar2;
  long *local_178 [2];
  Mat local_168 [96];
  Mat local_108 [96];
  Mat local_a8 [144];
  
  cv::Mat::Mat(&this->visibility_counter);
  cv::Mat::Mat(&this->merged_isomap);
  if ((0.0 <= merge_threshold) && (merge_threshold <= 90.0)) {
    cv::Mat::zeros((int)local_178,0x200,0x200);
    (**(code **)(*local_178[0] + 0x18))(local_178[0],local_178,this,0xffffffff);
    cv::Mat::~Mat(local_a8);
    cv::Mat::~Mat(local_108);
    cv::Mat::~Mat(local_168);
    cv::Mat::zeros((int)local_178,0x200,0x200);
    (**(code **)(*local_178[0] + 0x18))(local_178[0],local_178,&this->merged_isomap,0xffffffff);
    cv::Mat::~Mat(local_a8);
    cv::Mat::~Mat(local_108);
    cv::Mat::~Mat(local_168);
    fVar2 = merge_threshold * -2.8333333 + 255.0;
    fVar1 = 0.0;
    if (0.0 <= fVar2) {
      fVar1 = fVar2;
    }
    this->threshold = (uchar)(int)fVar1;
    return;
  }
  __assert_fail("merge_threshold >= 0.f && merge_threshold <= 90.f",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/examples/fit-model-multi.cpp"
                ,0x51,"WeightedIsomapAveraging::WeightedIsomapAveraging(float)");
}

Assistant:

WeightedIsomapAveraging(float merge_threshold = 90.0f)
    {
        assert(merge_threshold >= 0.f && merge_threshold <= 90.f);

        visibility_counter = cv::Mat::zeros(512, 512, CV_32SC1);
        merged_isomap = cv::Mat::zeros(512, 512, CV_32FC4);

        // map 0° to 255, 90° to 0:
        float alpha_thresh = (-255.f / 90.f) * merge_threshold + 255.f;
        if (alpha_thresh < 0.f) // could maybe happen due to float inaccuracies / rounding?
            alpha_thresh = 0.0f;
        threshold = static_cast<unsigned char>(alpha_thresh);
    }